

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O1

void __thiscall MeCab::Writer::~Writer(Writer *this)

{
  pointer pcVar1;
  char *pcVar2;
  
  this->_vptr_Writer = (_func_int **)&PTR__Writer_00140d50;
  pcVar1 = (this->what_).str_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->what_).str_.field_2) {
    operator_delete(pcVar1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->what_);
  std::ios_base::~ios_base((ios_base *)&(this->what_).field_0x70);
  (this->eon_format_).super_scoped_array<char>._vptr_scoped_array =
       (_func_int **)&PTR__scoped_array_00140bc8;
  pcVar2 = (this->eon_format_).super_scoped_array<char>.ptr_;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  (this->unk_format_).super_scoped_array<char>._vptr_scoped_array =
       (_func_int **)&PTR__scoped_array_00140bc8;
  pcVar2 = (this->unk_format_).super_scoped_array<char>.ptr_;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  (this->eos_format_).super_scoped_array<char>._vptr_scoped_array =
       (_func_int **)&PTR__scoped_array_00140bc8;
  pcVar2 = (this->eos_format_).super_scoped_array<char>.ptr_;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  (this->bos_format_).super_scoped_array<char>._vptr_scoped_array =
       (_func_int **)&PTR__scoped_array_00140bc8;
  pcVar2 = (this->bos_format_).super_scoped_array<char>.ptr_;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  (this->node_format_).super_scoped_array<char>._vptr_scoped_array =
       (_func_int **)&PTR__scoped_array_00140bc8;
  pcVar2 = (this->node_format_).super_scoped_array<char>.ptr_;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
    return;
  }
  return;
}

Assistant:

Writer::~Writer() {}